

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

ch_string * ch_loadstring(ch_context *vm,char *value,size_t size,_Bool copy_string)

{
  uint32_t uVar1;
  ch_string *key;
  char *string;
  
  key = ch_table_find_string(&vm->strings,value,size);
  if (key == (ch_string *)0x0) {
    string = value;
    if (copy_string) {
      string = (char *)malloc(size + 1);
      memcpy(string,value,size);
      string[size] = '\0';
    }
    key = (ch_string *)malloc(0x18);
    key->value = string;
    key->size = (uint32_t)size;
    uVar1 = ch_hash_string(string,size);
    key->hash = uVar1;
    (key->object).type = TYPE_STRING;
    ch_table_set(&vm->strings,key,(ch_primitive)ZEXT816(2));
  }
  return key;
}

Assistant:

ch_string *ch_loadstring(ch_context *vm, const char *value, size_t size,
                         bool copy_string) {
  ch_string *interned_string = ch_table_find_string(&vm->strings, value, size);

  if (interned_string != NULL) {
    return interned_string;
  }

  const char *final_value = value;
  if (copy_string) {
    char *copied_string = malloc(size + 1);
    memcpy(copied_string, value, size);
    copied_string[size] = '\0';

    final_value = copied_string;
  }

  ch_string *string = new_string(final_value, size);
  ch_table_set(&vm->strings, string, MAKE_NULL());

  return string;
}